

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O3

QCborArray __thiscall QCborArray::fromVariantList(QCborArray *this,QVariantList *list)

{
  QVariant *v;
  QVariant *variant;
  long lVar1;
  
  (this->d).d.ptr = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QCborArray(this);
  detach(this,(list->d).size);
  lVar1 = (list->d).size;
  if (lVar1 != 0) {
    variant = (list->d).ptr;
    lVar1 = lVar1 << 5;
    do {
      appendVariant((this->d).d.ptr,variant);
      variant = variant + 1;
      lVar1 = lVar1 + -0x20;
    } while (lVar1 != 0);
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
}

Assistant:

QCborArray QCborArray::fromVariantList(const QVariantList &list)
{
    QCborArray a;
    a.detach(list.size());
    for (const QVariant &v : list)
        appendVariant(a.d.data(), v);
    return a;
}